

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialGradientShadingPatternWritingTask.cpp
# Opt level: O3

void __thiscall
RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask
          (RadialGradientShadingPatternWritingTask *this,double inX0,double inY0,double inR0,
          double inX1,double inY1,double inR1,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__RadialGradientShadingPatternWritingTask_003a8848;
  pIVar1 = &this->mColorLine;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)pIVar1;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)pIVar1;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size = 0;
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->x0 = inX0;
  this->y0 = inY0;
  this->r0 = inR0;
  this->x1 = inX1;
  this->y1 = inY1;
  this->r1 = inR1;
  if (pIVar1 != inColorLine) {
    std::__cxx11::list<InterpretedGradientStop,std::allocator<InterpretedGradientStop>>::
    _M_assign_dispatch<std::_List_const_iterator<InterpretedGradientStop>>
              ((list<InterpretedGradientStop,std::allocator<InterpretedGradientStop>> *)pIVar1,
               (inColorLine->
               super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>).
               _M_impl._M_node.super__List_node_base._M_next,inColorLine);
  }
  this->mGradientExtend = inGradientExtend;
  dVar2 = inBounds->LowerLeftX;
  dVar3 = inBounds->LowerLeftY;
  dVar4 = inBounds->UpperRightY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = dVar4;
  (this->mBounds).LowerLeftX = dVar2;
  (this->mBounds).LowerLeftY = dVar3;
  dVar2 = inMatrix->a;
  dVar3 = inMatrix->b;
  dVar4 = inMatrix->c;
  dVar5 = inMatrix->d;
  dVar6 = inMatrix->f;
  (this->mMatrix).e = inMatrix->e;
  (this->mMatrix).f = dVar6;
  (this->mMatrix).c = dVar4;
  (this->mMatrix).d = dVar5;
  (this->mMatrix).a = dVar2;
  (this->mMatrix).b = dVar3;
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask(
    double inX0,
    double inY0,
    double inR0,
    double inX1,
    double inY1,
    double inR1,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
   x0 = inX0;
   y0 = inY0;
   r0 = inR0;
   x1 = inX1;
   y1 = inY1;
   r1 = inR1;
   mColorLine = inColorLine;
   mGradientExtend = inGradientExtend;
   mBounds = inBounds;
   mMatrix = inMatrix;
   mPatternObjectId = inPatternObjectId;
}